

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preserve_unknown_enum_test.cc
# Opt level: O3

void __thiscall
google::protobuf::PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test::TestBody
          (PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test *this)

{
  bool bVar1;
  MessageLite *pMVar2;
  char *pcVar3;
  string_view data;
  string_view data_00;
  Metadata MVar4;
  string serialized;
  MyMessage message2;
  DynamicMessageFactory factory;
  MyMessagePlusExtra orig_message;
  AssertHelper local_160;
  AssertHelper local_158;
  Message local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  string local_140;
  undefined1 local_120 [8];
  InternalMetadata local_118;
  DynamicMessageFactory local_c0;
  MyMessagePlusExtra local_80;
  
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::MyMessagePlusExtra
            (&local_80,(Arena *)0x0);
  anon_unknown_15::FillMessage(&local_80);
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  MessageLite::SerializeToString((MessageLite *)&local_80,&local_140);
  DynamicMessageFactory::DynamicMessageFactory(&local_c0);
  MVar4 = proto2_preserve_unknown_enum_unittest::MyMessage::GetMetadata
                    ((MyMessage *)
                     proto2_preserve_unknown_enum_unittest::_MyMessage_default_instance_);
  pMVar2 = &DynamicMessageFactory::GetPrototype(&local_c0,MVar4.descriptor)->super_MessageLite;
  pMVar2 = MessageLite::New(pMVar2,(Arena *)0x0);
  local_150.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)0x1;
  data._M_str = local_140._M_dataplus._M_p;
  data._M_len = local_140._M_string_length;
  bVar1 = MessageLite::ParseFromString(pMVar2,data);
  local_160.data_._0_1_ = bVar1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_120,"true","message->ParseFromString(serialized)",(bool *)&local_150,
             (bool *)&local_160);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message(&local_150);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = *(char **)local_118.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((long *)CONCAT71(local_150.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_150.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_150.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_150.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118.ptr_
                );
  }
  proto2_preserve_unknown_enum_unittest::MyMessage::MyMessage((MyMessage *)local_120,(Arena *)0x0);
  Message::CopyFrom((Message *)local_120,(Message *)pMVar2);
  Message::DiscardUnknownFields((Message *)local_120);
  local_158.data_._0_4_ = 0;
  local_160.data_ =
       (AssertHelperData *)
       proto2_preserve_unknown_enum_unittest::MyMessage::ByteSizeLong((MyMessage *)local_120);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_150,"0","message2.ByteSizeLong()",(int *)&local_158,
             (unsigned_long *)&local_160);
  if (local_150.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_148->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_160.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_160.data_ + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  local_140._M_string_length = 0;
  *local_140._M_dataplus._M_p = '\0';
  MessageLite::SerializeToString(pMVar2,&local_140);
  local_160.data_._0_1_ = 1;
  data_00._M_str = local_140._M_dataplus._M_p;
  data_00._M_len = local_140._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&local_80,data_00);
  local_158.data_._0_4_ = CONCAT31(local_158.data_._1_3_,bVar1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_150,"true","orig_message.ParseFromString(serialized)",
             (bool *)&local_160,(bool *)&local_158);
  if (local_150.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_148->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_160.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_160.data_ + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  anon_unknown_15::CheckMessage(&local_80);
  proto2_preserve_unknown_enum_unittest::MyMessage::~MyMessage((MyMessage *)local_120);
  (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  DynamicMessageFactory::~DynamicMessageFactory(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::~MyMessagePlusExtra(&local_80);
  return;
}

Assistant:

TEST(PreserveUnknownEnumTest, DynamicProto2HidesUnknownValues) {
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra orig_message;
  FillMessage(&orig_message);

  std::string serialized;
  orig_message.SerializeToString(&serialized);

  DynamicMessageFactory factory;
  std::unique_ptr<Message> message(
      factory
          .GetPrototype(
              proto2_preserve_unknown_enum_unittest::MyMessage::descriptor())
          ->New());
  EXPECT_EQ(true, message->ParseFromString(serialized));
  // The intermediate message has everything in its "unknown fields".
  proto2_preserve_unknown_enum_unittest::MyMessage message2;
  message2.CopyFrom(*message);
  message2.DiscardUnknownFields();
  EXPECT_EQ(0, message2.ByteSizeLong());

  // But when we pass it to the correct structure, all values are there.
  serialized.clear();
  message->SerializeToString(&serialized);
  EXPECT_EQ(true, orig_message.ParseFromString(serialized));
  CheckMessage(orig_message);
}